

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::ReadBinaryInterp
          (interp *this,string_view filename,void *data,size_t size,ReadBinaryOptions *options,
          Errors *errors,ModuleDesc *out_module)

{
  string_view filename_00;
  Result RVar1;
  undefined1 local_3f0 [8];
  BinaryReaderInterp reader;
  Errors *errors_local;
  ReadBinaryOptions *options_local;
  size_t size_local;
  void *data_local;
  string_view filename_local;
  
  filename_00._M_str = (char *)filename._M_len;
  filename_00._M_len = (size_t)this;
  reader.filename_._M_str = (char *)options;
  anon_unknown_1::BinaryReaderInterp::BinaryReaderInterp
            ((BinaryReaderInterp *)local_3f0,(ModuleDesc *)errors,filename_00,(Errors *)options,
             (Features *)size);
  RVar1 = ReadBinary(filename._M_str,(size_t)data,(BinaryReaderDelegate *)local_3f0,
                     (ReadBinaryOptions *)size);
  anon_unknown_1::BinaryReaderInterp::~BinaryReaderInterp((BinaryReaderInterp *)local_3f0);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryInterp(std::string_view filename,
                        const void* data,
                        size_t size,
                        const ReadBinaryOptions& options,
                        Errors* errors,
                        ModuleDesc* out_module) {
  BinaryReaderInterp reader(out_module, filename, errors, options.features);
  return ReadBinary(data, size, &reader, options);
}